

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O0

uint32_t icu_63::CollationFastLatin::getSecondaries(uint32_t variableTop,uint32_t pair)

{
  undefined4 local_10;
  uint32_t ce;
  uint32_t pair_local;
  uint32_t variableTop_local;
  
  if (pair < 0x10000) {
    if (pair < 0x1000) {
      if (variableTop < pair) {
        local_10 = 0xc0;
      }
      else {
        local_10 = pair;
        if (0xbff < pair) {
          local_10 = 0;
        }
      }
    }
    else {
      local_10 = getSecondariesFromOneShortCE(pair);
    }
  }
  else if ((pair & 0xffff) < 0x1000) {
    if (variableTop < (pair & 0xffff)) {
      local_10 = 0xc000c0;
    }
    else {
      local_10 = 0;
    }
  }
  else {
    local_10 = (pair & 0x3e003e0) + 0x200020;
  }
  return local_10;
}

Assistant:

uint32_t
CollationFastLatin::getSecondaries(uint32_t variableTop, uint32_t pair) {
    if(pair <= 0xffff) {
        // one mini CE
        if(pair >= MIN_SHORT) {
            pair = getSecondariesFromOneShortCE(pair);
        } else if(pair > variableTop) {
            pair = COMMON_SEC_PLUS_OFFSET;
        } else if(pair >= MIN_LONG) {
            pair = 0;  // variable
        }
        // else special mini CE
    } else {
        uint32_t ce = pair & 0xffff;
        if(ce >= MIN_SHORT) {
            pair = (pair & TWO_SECONDARIES_MASK) + TWO_SEC_OFFSETS;
        } else if(ce > variableTop) {
            pair = TWO_COMMON_SEC_PLUS_OFFSET;
        } else {
            U_ASSERT(ce >= MIN_LONG);
            pair = 0;  // variable
        }
    }
    return pair;
}